

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

int str_unpack(lua_State *L)

{
  size_t sVar1;
  KOption KVar2;
  int iVar3;
  char *pcVar4;
  lua_Integer pos;
  size_t n;
  size_t totalsize;
  float f;
  size_t ld;
  int ntoalign;
  int size;
  Header h;
  char *fmt;
  
  pcVar4 = luaL_checklstring(L,1,(size_t *)0x0);
  fmt = pcVar4;
  luaL_checklstring(L,2,&ld);
  pos = luaL_optinteger(L,3,1);
  sVar1 = ld;
  n = posrelatI(pos,ld);
  totalsize = n - 1;
  if (sVar1 < totalsize) {
    luaL_argerror(L,3,"initial position out of string");
  }
  h.islittle = 1;
  h.maxalign = 1;
  h.L = L;
  if (*pcVar4 != '\0') {
    KVar2 = getdetails(&h,totalsize,&fmt,&size,&ntoalign);
    if (ld - totalsize < (ulong)((long)ntoalign + (long)size)) {
      luaL_argerror(L,2,"data string too short");
    }
    luaL_checkstack(L,2,"too many results");
    iVar3 = (*(code *)(&DAT_00127ad0 + *(int *)(&DAT_00127ad0 + (ulong)KVar2 * 4)))();
    return iVar3;
  }
  lua_pushinteger(L,n);
  return 1;
}

Assistant:

static int str_unpack (lua_State *L) {
  Header h;
  const char *fmt = luaL_checkstring(L, 1);
  size_t ld;
  const char *data = luaL_checklstring(L, 2, &ld);
  size_t pos = posrelatI(luaL_optinteger(L, 3, 1), ld) - 1;
  int n = 0;  /* number of results */
  luaL_argcheck(L, pos <= ld, 3, "initial position out of string");
  initheader(L, &h);
  while (*fmt != '\0') {
    int size, ntoalign;
    KOption opt = getdetails(&h, pos, &fmt, &size, &ntoalign);
    luaL_argcheck(L, (size_t)ntoalign + size <= ld - pos, 2,
                    "data string too short");
    pos += ntoalign;  /* skip alignment */
    /* stack space for item + next position */
    luaL_checkstack(L, 2, "too many results");
    n++;
    switch (opt) {
      case Kint:
      case Kuint: {
        lua_Integer res = unpackint(L, data + pos, h.islittle, size,
                                       (opt == Kint));
        lua_pushinteger(L, res);
        break;
      }
      case Kfloat: {
        float f;
        copywithendian((char *)&f, data + pos, sizeof(f), h.islittle);
        lua_pushnumber(L, (lua_Number)f);
        break;
      }
      case Knumber: {
        lua_Number f;
        copywithendian((char *)&f, data + pos, sizeof(f), h.islittle);
        lua_pushnumber(L, f);
        break;
      }
      case Kdouble: {
        double f;
        copywithendian((char *)&f, data + pos, sizeof(f), h.islittle);
        lua_pushnumber(L, (lua_Number)f);
        break;
      }
      case Kchar: {
        lua_pushlstring(L, data + pos, size);
        break;
      }
      case Kstring: {
        size_t len = (size_t)unpackint(L, data + pos, h.islittle, size, 0);
        luaL_argcheck(L, len <= ld - pos - size, 2, "data string too short");
        lua_pushlstring(L, data + pos + size, len);
        pos += len;  /* skip string */
        break;
      }
      case Kzstr: {
        size_t len = strlen(data + pos);
        luaL_argcheck(L, pos + len < ld, 2,
                         "unfinished string for format 'z'");
        lua_pushlstring(L, data + pos, len);
        pos += len + 1;  /* skip string plus final '\0' */
        break;
      }
      case Kpaddalign: case Kpadding: case Knop:
        n--;  /* undo increment */
        break;
    }
    pos += size;
  }
  lua_pushinteger(L, pos + 1);  /* next position */
  return n + 1;
}